

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutnode.h
# Opt level: O0

void __thiscall rengine::LayoutNode::setLayoutTypeAsInt(LayoutNode *this,int layoutType)

{
  bool local_15;
  int layoutType_local;
  LayoutNode *this_local;
  
  local_15 = 3 < (uint)layoutType;
  if (local_15) {
    __assert_fail("layoutType >= 0 && layoutType < LayoutEngine::LastLayoutType",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/layoutnode.h"
                  ,0xbf,"void rengine::LayoutNode::setLayoutTypeAsInt(int)");
  }
  if (layoutType != (uint)(this->field_0x5c & 3)) {
    setLayoutType(this,layoutType);
    Signal<>::emit(&onLayoutTypeAsIntChanged,(SignalEmitter *)this);
  }
  return;
}

Assistant:

void setLayoutTypeAsInt(int layoutType) {
        assert(layoutType >= 0 && layoutType < LayoutEngine::LastLayoutType);
        if (layoutType == m_engine.layoutType)
            return;
        setLayoutType((LayoutEngine::LayoutType) layoutType);
        onLayoutTypeAsIntChanged.emit(this);
    }